

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void btreeLeaveAll(sqlite3 *db)

{
  Btree *p_00;
  Btree *p;
  int i;
  sqlite3 *db_local;
  
  for (p._4_4_ = 0; p._4_4_ < db->nDb; p._4_4_ = p._4_4_ + 1) {
    p_00 = db->aDb[p._4_4_].pBt;
    if (p_00 != (Btree *)0x0) {
      sqlite3BtreeLeave(p_00);
    }
  }
  return;
}

Assistant:

static void SQLITE_NOINLINE btreeLeaveAll(sqlite3 *db){
  int i;
  Btree *p;
  assert( sqlite3_mutex_held(db->mutex) );
  for(i=0; i<db->nDb; i++){
    p = db->aDb[i].pBt;
    if( p ) sqlite3BtreeLeave(p);
  }
}